

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmComputeShaderCase.cpp
# Opt level: O2

void __thiscall
vkt::SpirVAssembly::SpvAsmComputeShaderCase::SpvAsmComputeShaderCase
          (SpvAsmComputeShaderCase *this,TestContext *testCtx,char *name,char *description,
          ComputeShaderSpec *spec,ComputeTestFeatures features)

{
  allocator<char> local_6a;
  allocator<char> local_69;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,name,&local_69);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,description,&local_6a);
  TestCase::TestCase(&this->super_TestCase,testCtx,&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SpvAsmComputeShaderCase_00bd1020;
  ComputeShaderSpec::ComputeShaderSpec(&this->m_shaderSpec,spec);
  this->m_features = features;
  return;
}

Assistant:

SpvAsmComputeShaderCase::SpvAsmComputeShaderCase (tcu::TestContext& testCtx, const char* name, const char* description, const ComputeShaderSpec& spec, const ComputeTestFeatures features)
	: TestCase		(testCtx, name, description)
	, m_shaderSpec	(spec)
	, m_features	(features)
{
}